

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClipboardImpl.cpp
# Opt level: O0

void __thiscall sf::priv::ClipboardImpl::processEventsImpl(ClipboardImpl *this)

{
  bool bVar1;
  int iVar2;
  reference __src;
  deque<_XEvent,_std::allocator<_XEvent>_> *in_RDI;
  XEvent event;
  XEvent *in_stack_000001d8;
  ClipboardImpl *in_stack_000001e0;
  value_type *in_stack_ffffffffffffff28;
  undefined1 local_c8 [8];
  deque<_XEvent,_std::allocator<_XEvent>_> *in_stack_ffffffffffffff40;
  
  while (iVar2 = XCheckIfEvent((in_RDI->super__Deque_base<_XEvent,_std::allocator<_XEvent>_>).
                               _M_impl.super__Deque_impl_data._M_map_size,local_c8,
                               anon_unknown.dwarf_faa67::checkEvent,
                               (in_RDI->super__Deque_base<_XEvent,_std::allocator<_XEvent>_>).
                               _M_impl.super__Deque_impl_data._M_map), iVar2 != 0) {
    std::deque<_XEvent,_std::allocator<_XEvent>_>::push_back(in_RDI,in_stack_ffffffffffffff28);
  }
  while (bVar1 = std::deque<_XEvent,_std::allocator<_XEvent>_>::empty
                           ((deque<_XEvent,_std::allocator<_XEvent>_> *)0x194873),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    __src = std::deque<_XEvent,_std::allocator<_XEvent>_>::front(in_stack_ffffffffffffff40);
    memcpy(local_c8,__src,0xc0);
    std::deque<_XEvent,_std::allocator<_XEvent>_>::pop_front(in_RDI);
    processEvent(in_stack_000001e0,in_stack_000001d8);
  }
  return;
}

Assistant:

void ClipboardImpl::processEventsImpl()
{
    XEvent event;

    // Pick out the events that are interesting for this window
    while (XCheckIfEvent(m_display, &event, &checkEvent, reinterpret_cast<XPointer>(m_window)))
        m_events.push_back(event);

    // Handle the events for this window that we just picked out
    while (!m_events.empty())
    {
        event = m_events.front();
        m_events.pop_front();
        processEvent(event);
    }
}